

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
::insert_multi<std::pair<long_const,long>const&>
          (btree<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>
           *this,key_type *key,pair<const_long,_long> *v)

{
  node_type *pnVar1;
  iterator iVar2;
  
  if (*(long *)(this + 0x10) == 0) {
    pnVar1 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar1;
    *(node_type **)this = pnVar1;
  }
  iVar2 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
          ::internal_upper_bound<long>
                    ((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)this,key);
  if (iVar2.node ==
      (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
       *)0x0) {
    iVar2 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
            ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                   *)this);
  }
  iVar2 = internal_emplace<std::pair<long_const,long>const&>(this,iVar2,v);
  return iVar2;
}

Assistant:

auto btree<P>::insert_multi(const key_type &key, ValueType &&v) -> iterator {
        if (empty()) {
            mutable_root() = rightmost_ = new_leaf_root_node(1);
        }

        iterator iter = internal_upper_bound(key);
        if (iter.node == nullptr) {
            iter = end();
        }
        return internal_emplace(iter, std::forward<ValueType>(v));
    }